

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_Server_browseNext_single
               (UA_Server *server,UA_Session *session,UA_Boolean releaseContinuationPoint,
               UA_ByteString *continuationPoint,UA_BrowseResult *result)

{
  size_t sVar1;
  ContinuationPointEntry *pCVar2;
  size_t __n;
  int iVar3;
  ContinuationPointEntry *cp;
  
  result->statusCode = 0x804a0000;
  cp = (session->continuationPoints).lh_first;
  if (cp != (ContinuationPointEntry *)0x0) {
    sVar1 = continuationPoint->length;
    do {
      pCVar2 = (cp->pointers).le_next;
      __n = (cp->identifier).length;
      if (__n == sVar1) {
        iVar3 = bcmp((cp->identifier).data,continuationPoint->data,__n);
        if (iVar3 == 0) {
          result->statusCode = 0;
          if (releaseContinuationPoint) {
            removeCp(cp,session);
            return;
          }
          Service_Browse_single(server,session,cp,(UA_BrowseDescription *)0x0,0,result);
          return;
        }
      }
      cp = pCVar2;
    } while (pCVar2 != (ContinuationPointEntry *)0x0);
  }
  return;
}

Assistant:

static void
UA_Server_browseNext_single(UA_Server *server, UA_Session *session, UA_Boolean releaseContinuationPoint,
                            const UA_ByteString *continuationPoint, UA_BrowseResult *result) {
    result->statusCode = UA_STATUSCODE_BADCONTINUATIONPOINTINVALID;
    struct ContinuationPointEntry *cp, *temp;
    LIST_FOREACH_SAFE(cp, &session->continuationPoints, pointers, temp) {
        if(UA_ByteString_equal(&cp->identifier, continuationPoint)) {
            result->statusCode = UA_STATUSCODE_GOOD;
            if(!releaseContinuationPoint)
                Service_Browse_single(server, session, cp, NULL, 0, result);
            else
                removeCp(cp, session);
            break;
        }
    }
}